

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_resetCCtx_internal
                 (ZSTD_CCtx *zc,ZSTD_CCtx_params params,U64 pledgedSrcSize,
                 ZSTD_compResetPolicy_e crp,ZSTD_buffered_policy_e zbuff)

{
  ZSTD_cwksp *ws;
  long lVar1;
  int iVar2;
  int iVar3;
  BYTE *pBVar4;
  void *pvVar5;
  ZSTD_allocFunction p_Var6;
  ulong bytes;
  ZSTD_customMem customMem;
  U32 UVar7;
  size_t sVar8;
  U64 UVar9;
  size_t sVar10;
  BYTE *pBVar11;
  seqDef *psVar12;
  ldmEntry_t *__s;
  rawSeq *prVar13;
  void *pvVar14;
  ZSTD_compressedBlockState_t *pZVar15;
  U32 *pUVar16;
  ulong bytes_00;
  ulong uVar17;
  size_t bytes_01;
  uint uVar18;
  size_t bytes_02;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ZSTD_indexResetPolicy_e local_a4;
  size_t local_a0;
  
  sVar8 = ZSTD_checkCParams(params.cParams);
  if (0xffffffffffffff88 < sVar8) {
    __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params.cParams))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2fc8,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, ZSTD_CCtx_params, const U64, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  zc->isFirstBlock = 1;
  if (params.ldmParams.enableLdm != 0) {
    ZSTD_ldm_adjustParameters(&params.ldmParams,&params.cParams);
    if (params.ldmParams.hashLog < params.ldmParams.bucketSizeLog) {
      __assert_fail("params.ldmParams.hashLog >= params.ldmParams.bucketSizeLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2fcf,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, ZSTD_CCtx_params, const U64, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    if (0x1f < params.ldmParams.hashRateLog) {
      __assert_fail("params.ldmParams.hashRateLog < 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2fd0,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, ZSTD_CCtx_params, const U64, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    UVar9 = ZSTD_rollingHash_primePower(params.ldmParams.minMatchLength);
    (zc->ldmState).hashPower = UVar9;
  }
  if (pledgedSrcSize == 0) {
    uVar20 = 1;
  }
  else {
    uVar20 = 1L << ((byte)params.cParams.windowLog & 0x3f);
    if (pledgedSrcSize <= uVar20) {
      uVar20 = pledgedSrcSize;
    }
  }
  uVar21 = 0x20000;
  if (uVar20 < 0x20000) {
    uVar21 = uVar20;
  }
  local_a0 = 0;
  bytes = (uVar21 & 0xffffffff) / (ulong)((params.cParams.minMatch != 3) + 3);
  bytes_00 = (ulong)(uint)((int)bytes << 3);
  if (zbuff == ZSTDb_buffered) {
    uVar19 = 0;
    if (uVar20 < 0x20000) {
      uVar19 = (ulong)(0x20000U - (int)uVar21 >> 0xb);
    }
    local_a0 = uVar19 + (uVar21 >> 8) + uVar21 + 1;
  }
  uVar19 = 0;
  sVar8 = uVar20 + uVar21;
  if (zbuff != ZSTDb_buffered) {
    sVar8 = uVar19;
  }
  local_a4 = ZSTDirp_reset;
  sVar10 = ZSTD_sizeof_matchState(&params.cParams,1);
  UVar7 = params.ldmParams.enableLdm;
  uVar20 = 0;
  if (params.ldmParams.enableLdm != 0) {
    uVar20 = (uVar21 & 0xffffffff) / (ulong)params.ldmParams.minMatchLength;
  }
  iVar2 = zc->initialized;
  pBVar11 = (zc->blockState).matchState.window.nextSrc;
  pBVar4 = (zc->blockState).matchState.window.base;
  iVar3 = (zc->workspace).workspaceOversizedDuration;
  (zc->workspace).workspaceOversizedDuration = iVar3 + 1;
  uVar18 = params.ldmParams.hashLog - params.ldmParams.bucketSizeLog;
  uVar17 = (ulong)uVar18;
  if (params.ldmParams.hashLog < params.ldmParams.bucketSizeLog) {
    uVar17 = uVar19;
  }
  bytes_01 = 8L << ((byte)params.ldmParams.hashLog & 0x3f);
  if (params.ldmParams.enableLdm != 0) {
    uVar19 = (1L << ((byte)uVar17 & 0x3f)) + bytes_01;
  }
  bytes_02 = uVar20 * 0xc;
  lVar1 = bytes_02 + 0x4068;
  if (zc->staticSize == 0) {
    lVar1 = bytes_02 + 0x3be0;
  }
  uVar19 = lVar1 + bytes * 3 + local_a0 + uVar21 + 0x20 + sVar8 + bytes_00 + sVar10 + uVar19;
  pvVar14 = (zc->workspace).workspace;
  ws = &zc->workspace;
  if (((ulong)((long)(zc->workspace).workspaceEnd - (long)pvVar14) < uVar19) ||
     (uVar19 * 3 <= (ulong)((long)(zc->workspace).allocStart - (long)(zc->workspace).tableEnd) &&
      0x7f < iVar3)) {
    if (zc->staticSize != 0) {
      return 0xffffffffffffffc0;
    }
    (zc->workspace).tableValidEnd = (void *)0x0;
    (zc->workspace).allocStart = (void *)0x0;
    (zc->workspace).allocFailed = 0;
    (zc->workspace).workspaceOversizedDuration = 0;
    *(undefined8 *)&(zc->workspace).phase = 0;
    ws->workspace = (void *)0x0;
    (zc->workspace).workspaceEnd = (void *)0x0;
    (zc->workspace).objectEnd = (void *)0x0;
    (zc->workspace).tableEnd = (void *)0x0;
    pvVar5 = (zc->customMem).opaque;
    customMem.customFree._4_4_ = (int)((ulong)(zc->customMem).customFree >> 0x20);
    customMem._0_12_ = *(undefined1 (*) [12])&zc->customMem;
    customMem.opaque._0_4_ = (int)pvVar5;
    customMem.opaque._4_4_ = (int)((ulong)pvVar5 >> 0x20);
    ZSTD_free(pvVar14,customMem);
    p_Var6 = (zc->customMem).customAlloc;
    if (p_Var6 == (ZSTD_allocFunction)0x0) {
      pvVar14 = malloc(uVar19);
    }
    else {
      pvVar14 = (*p_Var6)((zc->customMem).opaque,uVar19);
    }
    if (pvVar14 == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    ZSTD_cwksp_init(ws,pvVar14,uVar19);
    if ((ulong)((long)(zc->workspace).allocStart - (long)(zc->workspace).tableEnd) < 0x23e0) {
      __assert_fail("ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3011,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, ZSTD_CCtx_params, const U64, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    pZVar15 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws,0x11f0);
    (zc->blockState).prevCBlock = pZVar15;
    if (pZVar15 == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    pZVar15 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws,0x11f0);
    (zc->blockState).nextCBlock = pZVar15;
    if (pZVar15 == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    pUVar16 = (U32 *)ZSTD_cwksp_reserve_object(ws,0x1800);
    zc->entropyWorkspace = pUVar16;
    if ((zc->blockState).nextCBlock == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
  }
  else {
    local_a4 = (ZSTD_indexResetPolicy_e)
               (0xdf000000 < (ulong)((long)pBVar11 - (long)pBVar4) || iVar2 == 0);
  }
  ZSTD_cwksp_clear(ws);
  memcpy(&zc->appliedParams,&params,0x90);
  (zc->blockState).matchState.cParams.windowLog =
       (int)CONCAT71(params.cParams._1_7_,(byte)params.cParams.windowLog);
  (zc->blockState).matchState.cParams.chainLog = params.cParams.chainLog;
  (zc->blockState).matchState.cParams.hashLog = params.cParams.hashLog;
  (zc->blockState).matchState.cParams.searchLog = params.cParams.searchLog;
  (zc->blockState).matchState.cParams.searchLog = params.cParams.searchLog;
  (zc->blockState).matchState.cParams.minMatch = params.cParams.minMatch;
  (zc->blockState).matchState.cParams.targetLength = params.cParams.targetLength;
  (zc->blockState).matchState.cParams.strategy = params.cParams.strategy;
  zc->pledgedSrcSizePlusOne = pledgedSrcSize + 1;
  zc->consumedSrcSize = SUB168(ZEXT816(0) << 0x20,0);
  zc->producedCSize = SUB168(ZEXT816(0) << 0x20,8);
  if (pledgedSrcSize + 1 == 0) {
    (zc->appliedParams).fParams.contentSizeFlag = 0;
  }
  zc->blockSize = uVar21;
  (zc->xxhState).total_len = 0;
  (zc->xxhState).v1 = 0x60ea27eeadc0b5d6;
  (zc->xxhState).v2 = 0xc2b2ae3d27d4eb4f;
  (zc->xxhState).v3 = 0;
  (zc->xxhState).v4 = 0x61c8864e7a143579;
  (zc->xxhState).mem64[0] = 0;
  (zc->xxhState).mem64[1] = 0;
  (zc->xxhState).mem64[2] = 0;
  (zc->xxhState).mem64[3] = 0;
  (zc->xxhState).memsize = 0;
  (zc->xxhState).reserved[0] = 0;
  zc->stage = ZSTDcs_init;
  zc->dictID = 0;
  ZSTD_reset_compressedBlockState((zc->blockState).prevCBlock);
  pBVar11 = ZSTD_cwksp_reserve_buffer(ws,uVar21 + 0x20);
  (zc->seqStore).litStart = pBVar11;
  (zc->seqStore).maxNbLit = uVar21;
  zc->inBuffSize = sVar8;
  pBVar11 = ZSTD_cwksp_reserve_buffer(ws,sVar8);
  zc->inBuff = (char *)pBVar11;
  zc->outBuffSize = local_a0;
  pBVar11 = ZSTD_cwksp_reserve_buffer(ws,local_a0);
  zc->outBuff = (char *)pBVar11;
  if (UVar7 != 0) {
    sVar8 = 1L << ((byte)uVar18 & 0x3f);
    pBVar11 = ZSTD_cwksp_reserve_buffer(ws,sVar8);
    (zc->ldmState).bucketOffsets = pBVar11;
    memset(pBVar11,0,sVar8);
  }
  ZSTD_referenceExternalSequences(zc,(rawSeq *)0x0,0);
  (zc->seqStore).maxNbSeq = bytes;
  pBVar11 = ZSTD_cwksp_reserve_buffer(ws,bytes);
  (zc->seqStore).llCode = pBVar11;
  pBVar11 = ZSTD_cwksp_reserve_buffer(ws,bytes);
  (zc->seqStore).mlCode = pBVar11;
  pBVar11 = ZSTD_cwksp_reserve_buffer(ws,bytes);
  (zc->seqStore).ofCode = pBVar11;
  psVar12 = (seqDef *)ZSTD_cwksp_reserve_aligned(ws,bytes_00);
  (zc->seqStore).sequencesStart = psVar12;
  sVar8 = ZSTD_reset_matchState
                    (&(zc->blockState).matchState,ws,&params.cParams,crp,local_a4,
                     ZSTD_resetTarget_CCtx);
  if (sVar8 < 0xffffffffffffff89) {
    if (UVar7 != 0) {
      __s = (ldmEntry_t *)ZSTD_cwksp_reserve_aligned(ws,bytes_01);
      (zc->ldmState).hashTable = __s;
      memset(__s,0,bytes_01);
      prVar13 = (rawSeq *)ZSTD_cwksp_reserve_aligned(ws,bytes_02);
      zc->ldmSequences = prVar13;
      zc->maxNbLdmSequences = uVar20;
      (zc->ldmState).window.base = "";
      (zc->ldmState).window.dictBase = "";
      (zc->ldmState).window.nextSrc = (BYTE *)"File %s";
      (zc->ldmState).window.dictLimit = 1;
      (zc->ldmState).window.lowLimit = 1;
    }
    zc->initialized = 1;
    sVar8 = 0;
  }
  return sVar8;
}

Assistant:

static size_t ZSTD_resetCCtx_internal(ZSTD_CCtx* zc,
                                      ZSTD_CCtx_params params,
                                      U64 const pledgedSrcSize,
                                      ZSTD_compResetPolicy_e const crp,
                                      ZSTD_buffered_policy_e const zbuff)
{
    ZSTD_cwksp* const ws = &zc->workspace;
    DEBUGLOG(4, "ZSTD_resetCCtx_internal: pledgedSrcSize=%u, wlog=%u",
                (U32)pledgedSrcSize, params.cParams.windowLog);
    assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));

    zc->isFirstBlock = 1;

    if (params.ldmParams.enableLdm) {
        /* Adjust long distance matching parameters */
        ZSTD_ldm_adjustParameters(&params.ldmParams, &params.cParams);
        assert(params.ldmParams.hashLog >= params.ldmParams.bucketSizeLog);
        assert(params.ldmParams.hashRateLog < 32);
        zc->ldmState.hashPower = ZSTD_rollingHash_primePower(params.ldmParams.minMatchLength);
    }

    {   size_t const windowSize = MAX(1, (size_t)MIN(((U64)1 << params.cParams.windowLog), pledgedSrcSize));
        size_t const blockSize = MIN(ZSTD_BLOCKSIZE_MAX, windowSize);
        U32    const divider = (params.cParams.minMatch==3) ? 3 : 4;
        size_t const maxNbSeq = blockSize / divider;
        size_t const tokenSpace = ZSTD_cwksp_alloc_size(WILDCOPY_OVERLENGTH + blockSize)
                                + ZSTD_cwksp_alloc_size(maxNbSeq * sizeof(seqDef))
                                + 3 * ZSTD_cwksp_alloc_size(maxNbSeq * sizeof(BYTE));
        size_t const buffOutSize = (zbuff==ZSTDb_buffered) ? ZSTD_compressBound(blockSize)+1 : 0;
        size_t const buffInSize = (zbuff==ZSTDb_buffered) ? windowSize + blockSize : 0;
        size_t const matchStateSize = ZSTD_sizeof_matchState(&params.cParams, /* forCCtx */ 1);
        size_t const maxNbLdmSeq = ZSTD_ldm_getMaxNbSeq(params.ldmParams, blockSize);

        ZSTD_indexResetPolicy_e needsIndexReset = zc->initialized ? ZSTDirp_continue : ZSTDirp_reset;

        if (ZSTD_indexTooCloseToMax(zc->blockState.matchState.window)) {
            needsIndexReset = ZSTDirp_reset;
        }

        ZSTD_cwksp_bump_oversized_duration(ws, 0);

        /* Check if workspace is large enough, alloc a new one if needed */
        {   size_t const cctxSpace = zc->staticSize ? ZSTD_cwksp_alloc_size(sizeof(ZSTD_CCtx)) : 0;
            size_t const entropySpace = ZSTD_cwksp_alloc_size(HUF_WORKSPACE_SIZE);
            size_t const blockStateSpace = 2 * ZSTD_cwksp_alloc_size(sizeof(ZSTD_compressedBlockState_t));
            size_t const bufferSpace = ZSTD_cwksp_alloc_size(buffInSize) + ZSTD_cwksp_alloc_size(buffOutSize);
            size_t const ldmSpace = ZSTD_ldm_getTableSize(params.ldmParams);
            size_t const ldmSeqSpace = ZSTD_cwksp_alloc_size(maxNbLdmSeq * sizeof(rawSeq));

            size_t const neededSpace =
                cctxSpace +
                entropySpace +
                blockStateSpace +
                ldmSpace +
                ldmSeqSpace +
                matchStateSize +
                tokenSpace +
                bufferSpace;

            int const workspaceTooSmall = ZSTD_cwksp_sizeof(ws) < neededSpace;
            int const workspaceWasteful = ZSTD_cwksp_check_wasteful(ws, neededSpace);

            DEBUGLOG(4, "Need %zuKB workspace, including %zuKB for match state, and %zuKB for buffers",
                        neededSpace>>10, matchStateSize>>10, bufferSpace>>10);
            DEBUGLOG(4, "windowSize: %zu - blockSize: %zu", windowSize, blockSize);

            if (workspaceTooSmall || workspaceWasteful) {
                DEBUGLOG(4, "Resize workspaceSize from %zuKB to %zuKB",
                            ZSTD_cwksp_sizeof(ws) >> 10,
                            neededSpace >> 10);

                RETURN_ERROR_IF(zc->staticSize, memory_allocation, "static cctx : no resize");

                needsIndexReset = ZSTDirp_reset;

                ZSTD_cwksp_free(ws, zc->customMem);
                FORWARD_IF_ERROR(ZSTD_cwksp_create(ws, neededSpace, zc->customMem));

                DEBUGLOG(5, "reserving object space");
                /* Statically sized space.
                 * entropyWorkspace never moves,
                 * though prev/next block swap places */
                assert(ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t)));
                zc->blockState.prevCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.prevCBlock == NULL, memory_allocation, "couldn't allocate prevCBlock");
                zc->blockState.nextCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.nextCBlock == NULL, memory_allocation, "couldn't allocate nextCBlock");
                zc->entropyWorkspace = (U32*) ZSTD_cwksp_reserve_object(ws, HUF_WORKSPACE_SIZE);
                RETURN_ERROR_IF(zc->blockState.nextCBlock == NULL, memory_allocation, "couldn't allocate entropyWorkspace");
        }   }

        ZSTD_cwksp_clear(ws);

        /* init params */
        zc->appliedParams = params;
        zc->blockState.matchState.cParams = params.cParams;
        zc->pledgedSrcSizePlusOne = pledgedSrcSize+1;
        zc->consumedSrcSize = 0;
        zc->producedCSize = 0;
        if (pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            zc->appliedParams.fParams.contentSizeFlag = 0;
        DEBUGLOG(4, "pledged content size : %u ; flag : %u",
            (unsigned)pledgedSrcSize, zc->appliedParams.fParams.contentSizeFlag);
        zc->blockSize = blockSize;

        XXH64_reset(&zc->xxhState, 0);
        zc->stage = ZSTDcs_init;
        zc->dictID = 0;

        ZSTD_reset_compressedBlockState(zc->blockState.prevCBlock);

        /* ZSTD_wildcopy() is used to copy into the literals buffer,
         * so we have to oversize the buffer by WILDCOPY_OVERLENGTH bytes.
         */
        zc->seqStore.litStart = ZSTD_cwksp_reserve_buffer(ws, blockSize + WILDCOPY_OVERLENGTH);
        zc->seqStore.maxNbLit = blockSize;

        /* buffers */
        zc->inBuffSize = buffInSize;
        zc->inBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffInSize);
        zc->outBuffSize = buffOutSize;
        zc->outBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffOutSize);

        /* ldm bucketOffsets table */
        if (params.ldmParams.enableLdm) {
            /* TODO: avoid memset? */
            size_t const ldmBucketSize =
                  ((size_t)1) << (params.ldmParams.hashLog -
                                  params.ldmParams.bucketSizeLog);
            zc->ldmState.bucketOffsets = ZSTD_cwksp_reserve_buffer(ws, ldmBucketSize);
            memset(zc->ldmState.bucketOffsets, 0, ldmBucketSize);
        }

        /* sequences storage */
        ZSTD_referenceExternalSequences(zc, NULL, 0);
        zc->seqStore.maxNbSeq = maxNbSeq;
        zc->seqStore.llCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.mlCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.ofCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.sequencesStart = (seqDef*)ZSTD_cwksp_reserve_aligned(ws, maxNbSeq * sizeof(seqDef));

        FORWARD_IF_ERROR(ZSTD_reset_matchState(
            &zc->blockState.matchState,
            ws,
            &params.cParams,
            crp,
            needsIndexReset,
            ZSTD_resetTarget_CCtx));

        /* ldm hash table */
        if (params.ldmParams.enableLdm) {
            /* TODO: avoid memset? */
            size_t const ldmHSize = ((size_t)1) << params.ldmParams.hashLog;
            zc->ldmState.hashTable = (ldmEntry_t*)ZSTD_cwksp_reserve_aligned(ws, ldmHSize * sizeof(ldmEntry_t));
            memset(zc->ldmState.hashTable, 0, ldmHSize * sizeof(ldmEntry_t));
            zc->ldmSequences = (rawSeq*)ZSTD_cwksp_reserve_aligned(ws, maxNbLdmSeq * sizeof(rawSeq));
            zc->maxNbLdmSequences = maxNbLdmSeq;

            ZSTD_window_init(&zc->ldmState.window);
            ZSTD_window_clear(&zc->ldmState.window);
        }

        DEBUGLOG(3, "wksp: finished allocating, %zd bytes remain available", ZSTD_cwksp_available_space(ws));
        zc->initialized = 1;

        return 0;
    }
}